

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsnnode.h
# Opt level: O2

int __thiscall WSNNode::layer(WSNNode *this)

{
  int iVar1;
  float fVar2;
  
  fVar2 = SQRT((float)(this->y * this->y + this->x * this->x));
  if (fVar2 < 303.0) {
    return 0;
  }
  if (428.0 <= fVar2) {
    if (524.0 <= fVar2) {
      return (608.0 <= fVar2) + 3;
    }
    iVar1 = 2;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

float distance()const{return sqrt(float(x*x+y*y));}